

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLLinOp::setDomainBC(MLLinOp *this,Array<BCType,_3> *a_lobc,Array<BCType,_3> *a_hibc)

{
  int iVar1;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *this_00;
  allocator_type *paVar2;
  value_type *in_RDX;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *in_RDI;
  int ncomp;
  allocator_type *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  undefined1 *puVar3;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *a_hibc_00;
  undefined4 in_stack_ffffffffffffffa4;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_39;
  int local_1c;
  value_type *local_18;
  
  local_18 = in_RDX;
  iVar1 = (**(code **)((in_RDI->
                       super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       ).
                       super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[3]._M_elems + 1))();
  this_00 = (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             *)(long)iVar1;
  a_hibc_00 = &local_39;
  local_1c = iVar1;
  std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
            ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x126dac9);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector(this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  paVar2 = (allocator_type *)(long)local_1c;
  puVar3 = &stack0xffffffffffffffa7;
  std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
            ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x126db09);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector(this_00,(size_type)puVar3,local_18,paVar2);
  setDomainBC((MLLinOp *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_RDI,a_hibc_00);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             *)0x126db41);
  std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
            ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x126db4b);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             *)0x126db55);
  std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
            ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x126db5f);
  return;
}

Assistant:

void
MLLinOp::setDomainBC (const Array<BCType,AMREX_SPACEDIM>& a_lobc,
                      const Array<BCType,AMREX_SPACEDIM>& a_hibc) noexcept
{
    const int ncomp = getNComp();
    setDomainBC(Vector<Array<BCType,AMREX_SPACEDIM> >(ncomp,a_lobc),
                Vector<Array<BCType,AMREX_SPACEDIM> >(ncomp,a_hibc));
}